

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O1

Env * leveldb::NewMemEnv(Env *base_env)

{
  long lVar1;
  Env *pEVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pEVar2 = (Env *)operator_new(0x68);
  pEVar2[1]._vptr_Env = (_func_int **)base_env;
  pEVar2->_vptr_Env = (_func_int **)&PTR__InMemoryEnv_013e3120;
  pEVar2[2]._vptr_Env = (_func_int **)0x0;
  pEVar2[3]._vptr_Env = (_func_int **)0x0;
  pEVar2[4]._vptr_Env = (_func_int **)0x0;
  pEVar2[5]._vptr_Env = (_func_int **)0x0;
  pEVar2[6]._vptr_Env = (_func_int **)0x0;
  *(undefined4 *)&pEVar2[8]._vptr_Env = 0;
  pEVar2[9]._vptr_Env = (_func_int **)0x0;
  pEVar2[10]._vptr_Env = (_func_int **)(pEVar2 + 8);
  pEVar2[0xb]._vptr_Env = (_func_int **)(pEVar2 + 8);
  pEVar2[0xc]._vptr_Env = (_func_int **)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pEVar2;
  }
  __stack_chk_fail();
}

Assistant:

Env* NewMemEnv(Env* base_env) { return new InMemoryEnv(base_env); }